

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O0

BinaryLocation __thiscall
wasm::Debug::LocationUpdater::getNewFuncEnd(LocationUpdater *this,BinaryLocation oldAddr)

{
  BinaryLocation BVar1;
  bool bVar2;
  pointer pvVar3;
  FunctionLocations newLocations;
  FunctionLocations oldLocations;
  _Node_iterator_base<std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>,_false>
  local_30;
  const_iterator iter;
  Function *func;
  BinaryLocation oldAddr_local;
  LocationUpdater *this_local;
  
  iter.
  super__Node_iterator_base<std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>,_false>
             )FuncAddrMap::getEnd(&this->oldFuncAddrMap,oldAddr);
  if (iter.
      super__Node_iterator_base<std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>,_false>
      ._M_cur != (__node_type *)0x0) {
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Function_*,_wasm::BinaryLocations::FunctionLocations,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>_>_>
         ::find(&this->newLocations->functions,(key_type *)&iter);
    oldLocations._4_8_ =
         std::
         unordered_map<wasm::Function_*,_wasm::BinaryLocations::FunctionLocations,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>_>_>
         ::end(&this->newLocations->functions);
    bVar2 = std::__detail::operator!=
                      (&local_30,
                       (_Node_iterator_base<std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>,_false>
                        *)&oldLocations.declarations);
    if (bVar2) {
      oldLocations.start =
           *(BinaryLocation *)
            ((long)iter.
                   super__Node_iterator_base<std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>,_false>
                   ._M_cur + 0x1b8);
      pvVar3 = std::__detail::
               _Node_const_iterator<std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>,_false,_false>
               ::operator->((_Node_const_iterator<std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>,_false,_false>
                             *)&local_30);
      BVar1 = (pvVar3->second).end;
      if (oldAddr == oldLocations.start) {
        return BVar1;
      }
      if (oldAddr == oldLocations.start - 1) {
        return BVar1 - 1;
      }
      handle_unreachable("invalid func end",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp"
                         ,0x23b);
    }
  }
  return 0;
}

Assistant:

BinaryLocation getNewFuncEnd(BinaryLocation oldAddr) const {
    if (auto* func = oldFuncAddrMap.getEnd(oldAddr)) {
      // The function might have been optimized away, check.
      auto iter = newLocations.functions.find(func);
      if (iter != newLocations.functions.end()) {
        auto oldLocations = func->funcLocation;
        auto newLocations = iter->second;
        if (oldAddr == oldLocations.end) {
          return newLocations.end;
        } else if (oldAddr == oldLocations.end - 1) {
          return newLocations.end - 1;
        } else {
          WASM_UNREACHABLE("invalid func end");
        }
      }
    }
    return 0;
  }